

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall
MakefileGenerator::writeSubTargets
          (MakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> targets,
          int flags)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  QMakeProject *pQVar4;
  SubTarget *pSVar5;
  QMakeLocalFileName *pQVar6;
  _List_node_base *p_Var7;
  Data *pDVar8;
  QString *pQVar9;
  QString *pQVar10;
  QString string;
  QString string_00;
  int *piVar11;
  Data *pDVar12;
  QHash<QString,_QHashDummyValue> QVar13;
  ProString *pPVar14;
  char16_t *pcVar15;
  char (*pacVar16) [6];
  undefined8 uVar17;
  qsizetype qVar18;
  Data *pDVar19;
  bool bVar20;
  char cVar21;
  bool bVar22;
  ProStringList *pPVar23;
  QTextStream *pQVar24;
  iterator iVar25;
  iterator iVar26;
  QList<ProString> *pQVar27;
  ProStringList *pPVar28;
  qsizetype qVar29;
  const_iterator cVar30;
  Node<QString,_QHashDummyValue> *pNVar31;
  uint in_ECX;
  undefined4 in_register_00000014;
  QList<MakefileGenerator::SubTarget_*> *this_00;
  char *pcVar32;
  QString *pQVar33;
  storage_type *psVar34;
  MakefileGenerator *pMVar35;
  SequentialInstallData *pSVar36;
  ulong uVar37;
  ulong uVar38;
  ProString *pPVar39;
  ProString *pPVar40;
  long lVar41;
  long in_FS_OFFSET;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QAnyStringView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QStringView config;
  QStringView config_00;
  undefined1 in_stack_fffffffffffffc38 [12];
  SequentialInstallData *pSVar62;
  default_delete<SequentialInstallData> *local_388;
  QHash<QString,_QHashDummyValue> moved;
  QMakeLocalFileName *pQStack_360;
  ProString *local_358;
  undefined1 local_338 [40];
  QStringBuilder<QStringBuilder<const_char_(&)[2],_const_ProString_&>,_const_char_(&)[2]> local_310;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> local_2f8;
  QString local_2d8;
  QString local_2b8;
  QString local_298;
  undefined1 local_278 [32];
  QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]> local_258;
  QHash<QString,_QHashDummyValue> local_230;
  QString local_228;
  QStringBuilder<QStringBuilder<const_char_(&)[2],_const_QString_&>,_const_char_(&)[2]> local_208;
  QString local_1e8;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> local_1c8;
  undefined1 local_1a8 [32];
  QString local_188;
  QString local_168;
  QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]> local_148;
  QString local_118;
  QString local_f8;
  ProKey rtkey;
  QString local_a8;
  QArrayDataPointer<QString> local_88;
  ProKey rkey;
  
  this_00 = (QList<MakefileGenerator::SubTarget_*> *)CONCAT44(in_register_00000014,flags);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = this->project;
  ProKey::ProKey(&rkey,"QMAKE_EXTRA_INCLUDES");
  pPVar23 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rkey);
  if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pPVar23->super_QList<ProString>).d.size != 0) {
    pPVar39 = (pPVar23->super_QList<ProString>).d.ptr;
    do {
      pQVar24 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_3e32fa + 0xb);
      pQVar24 = operator<<(pQVar24,pPVar39);
      Qt::endl(pQVar24);
      pPVar39 = pPVar39 + 1;
    } while (pPVar39 !=
             (pPVar23->super_QList<ProString>).d.ptr + (pPVar23->super_QList<ProString>).d.size);
  }
  if ((in_ECX & 4) == 0) {
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[6])(this,t);
    QTextStream::operator<<(t,"SUBTARGETS    = ");
    if ((this_00->d).size != 0) {
      uVar38 = 0;
      do {
        pQVar24 = (QTextStream *)QTextStream::operator<<(t," \\\n\t\t");
        QTextStream::operator<<(pQVar24,(QString *)&(this_00->d).ptr[uVar38]->target);
        uVar38 = uVar38 + 1;
      } while (uVar38 < (ulong)(this_00->d).size);
    }
    pQVar24 = (QTextStream *)Qt::endl(t);
    Qt::endl(pQVar24);
  }
  writeExtraVariables(this,t);
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  local_88.size = 0;
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d._0_4_ = 0xaaaaaaaa;
  local_a8.d.d._4_4_ = 0xaaaaaaaa;
  local_a8.d.ptr._0_4_ = 0xaaaaaaaa;
  local_a8.d.ptr._4_4_ = 0xaaaaaaaa;
  pQVar4 = this->project;
  ProKey::ProKey(&rtkey,"QMAKE_ABSOLUTE_SOURCE_PATH");
  QMakeEvaluator::first(&rkey.super_ProString,&pQVar4->super_QMakeEvaluator,&rtkey);
  ProString::toQString(&local_a8,&rkey.super_ProString);
  if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((in_ECX & 8) == 0) {
    QVar42.m_data = (storage_type *)0xa;
    QVar42.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar42);
    rtkey.super_ProString.m_string.d.d = rkey.super_ProString.m_string.d.d;
    rtkey.super_ProString.m_string.d.ptr = rkey.super_ProString.m_string.d.ptr;
    rtkey.super_ProString.m_string.d.size = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)&rtkey);
    QList<QString>::end((QList<QString> *)&local_88);
    QVar43.m_data = (storage_type *)0x3;
    QVar43.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar43);
    moved.d = (Data *)rkey.super_ProString.m_string.d.d;
    pQStack_360 = (QMakeLocalFileName *)rkey.super_ProString.m_string.d.ptr;
    local_358 = (ProString *)rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)&moved);
    QList<QString>::end((QList<QString> *)&local_88);
    QVar44.m_data = (storage_type *)0x5;
    QVar44.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar44);
    local_148.a.a = (char (*) [6])rkey.super_ProString.m_string.d.d;
    local_148.a.b.d.d = (Data *)rkey.super_ProString.m_string.d.ptr;
    local_148.a.b.d.ptr = (char16_t *)rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)&local_148);
    QList<QString>::end((QList<QString> *)&local_88);
    QVar45.m_data = (storage_type *)0x9;
    QVar45.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar45);
    local_258.a.a = (char (*) [6])rkey.super_ProString.m_string.d.d;
    local_258.a.b.d.d = (Data *)rkey.super_ProString.m_string.d.ptr;
    local_258.a.b.d.ptr = (char16_t *)rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)(local_278 + 0x20));
    QList<QString>::end((QList<QString> *)&local_88);
    pcVar32 = "install_subtargets";
    if ((in_ECX & 1) == 0) {
      pcVar32 = "install";
    }
    psVar34 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar34 + (long)(pcVar32 + 1);
      psVar34 = psVar34 + 1;
    } while (*pcVar1 != '\0');
    QVar46.m_data = psVar34;
    QVar46.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar46);
    local_f8.d.d = rkey.super_ProString.m_string.d.d;
    local_f8.d.ptr = rkey.super_ProString.m_string.d.ptr;
    local_f8.d.size = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_f8);
    QList<QString>::end((QList<QString> *)&local_88);
    pcVar32 = "uninstall_subtargets";
    if ((in_ECX & 1) == 0) {
      pcVar32 = "uninstall";
    }
    psVar34 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar34 + (long)(pcVar32 + 1);
      psVar34 = psVar34 + 1;
    } while (*pcVar1 != '\0');
    QVar47.m_data = psVar34;
    QVar47.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar47);
    local_118.d.d = rkey.super_ProString.m_string.d.d;
    local_118.d.ptr = rkey.super_ProString.m_string.d.ptr;
    local_118.d.size = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_118);
    QList<QString>::end((QList<QString> *)&local_88);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Data *)local_258.a.a != (Data *)0x0) {
      LOCK();
      (((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i =
           (((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_258.a.a,2,0x10);
      }
    }
    if ((QArrayData *)local_148.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_148.a.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_148.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_148.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148.a.a,2,0x10);
      }
    }
    if (moved.d != (Data *)0x0) {
      LOCK();
      ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
      }
    }
    if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar4 = this->project;
  QVar48.m_data = &DAT_0000000c;
  QVar48.m_size = (qsizetype)&rkey;
  QString::fromUtf8(QVar48);
  pDVar8 = rkey.super_ProString.m_string.d.d;
  config.m_data = rkey.super_ProString.m_string.d.ptr;
  config.m_size = rkey.super_ProString.m_string.d.size;
  bVar20 = QMakeEvaluator::isActiveConfig(&pQVar4->super_QMakeEvaluator,config,false);
  if (pDVar8 != (Data *)0x0) {
    LOCK();
    (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
    }
  }
  pSVar36 = (SequentialInstallData *)t;
  if ((this_00->d).size == 0) {
    local_388 = (default_delete<SequentialInstallData> *)0x0;
  }
  else {
    local_388 = (default_delete<SequentialInstallData> *)0x0;
    uVar38 = 0;
    do {
      pSVar5 = (this_00->d).ptr[uVar38];
      rtkey.super_ProString.m_string.d.d = (pSVar5->in_directory).d.d;
      rtkey.super_ProString.m_string.d.ptr = (pSVar5->in_directory).d.ptr;
      rtkey.super_ProString.m_string.d.size = (pSVar5->in_directory).d.size;
      if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((rtkey.super_ProString.m_string.d.size != 0) &&
         (cVar21 = QString::endsWith((QString *)&rtkey,0x2e2bf0), cVar21 == '\0')) {
        QString::append((QString *)&rtkey);
      }
      moved.d = (Data *)(pSVar5->out_directory).d.d;
      pQVar6 = (QMakeLocalFileName *)(pSVar5->out_directory).d.ptr;
      pPVar39 = (ProString *)(pSVar5->out_directory).d.size;
      if (moved.d != (Data *)0x0) {
        LOCK();
        (((QArrayData *)&(moved.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&(moved.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((pPVar39 != (ProString *)0x0) &&
         (cVar21 = QString::endsWith((QString *)&moved,0x2e2bf0), cVar21 == '\0')) {
        QString::append((QString *)&moved);
      }
      pQStack_360 = pQVar6;
      local_358 = pPVar39;
      if (((undefined1 *)local_a8.d.size != (undefined1 *)0x0) &&
         (cVar21 = QString::startsWith((QString *)&moved,(CaseSensitivity)&local_a8), cVar21 != '\0'
         )) {
        QString::mid((longlong)&local_f8,(longlong)&moved);
        qVar29 = local_f8.d.size;
        rkey.super_ProString.m_string.d.size = (qsizetype)local_f8.d.ptr;
        rkey.super_ProString.m_string.d.ptr = (char16_t *)local_f8.d.d;
        rkey.super_ProString.m_string.d.d = (Data *)&Option::output_dir;
        local_f8.d.d = (Data *)0x0;
        local_f8.d.ptr = (char16_t *)0x0;
        local_f8.d.size = 0;
        qVar18 = local_f8.d.size;
        local_f8.d.size._0_4_ = (undefined4)qVar29;
        local_f8.d.size._4_4_ = SUB84(qVar29,4);
        rkey.super_ProString.m_offset = (undefined4)local_f8.d.size;
        rkey.super_ProString.m_length = local_f8.d.size._4_4_;
        local_f8.d.size = qVar18;
        QStringBuilder<QString_&,_QString>::convertTo<QString>
                  ((QString *)(local_278 + 0x20),(QStringBuilder<QString_&,_QString> *)&rkey);
        pacVar16 = local_258.a.a;
        QVar13 = moved;
        local_258.a.a = (char (*) [6])moved.d;
        moved.d = (Data *)pacVar16;
        pQStack_360 = (QMakeLocalFileName *)local_258.a.b.d.d;
        local_358 = (ProString *)local_258.a.b.d.ptr;
        local_258.a.b.d.d = (Data *)pQVar6;
        local_258.a.b.d.ptr = (char16_t *)pPVar39;
        if (QVar13.d != (Data *)0x0) {
          LOCK();
          ((QVar13.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
               ((QVar13.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((QVar13.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)QVar13.d,2,0x10);
          }
        }
        if (rkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
          LOCK();
          *(int *)rkey.super_ProString.m_string.d.ptr =
               *(int *)rkey.super_ProString.m_string.d.ptr + -1;
          UNLOCK();
          if (*(int *)rkey.super_ProString.m_string.d.ptr == 0) {
            QArrayData::deallocate((QArrayData *)rkey.super_ProString.m_string.d.ptr,2,0x10);
          }
        }
        if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      local_258.a.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_258.a.a = (char (*) [6])&DAT_aaaaaaaaaaaaaaaa;
      local_258.a.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      if (local_358 == (ProString *)0x0) {
        QVar49.m_data = (storage_type *)0x2;
        QVar49.m_size = (qsizetype)&rkey;
        QString::fromUtf8(QVar49);
        local_258.a.a = (char (*) [6])rkey.super_ProString.m_string.d.d;
        local_258.a.b.d.d = (Data *)rkey.super_ProString.m_string.d.ptr;
        local_258.a.b.d.ptr = (char16_t *)rkey.super_ProString.m_string.d.size;
      }
      else {
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_118,this,&moved);
        local_148.a.b.d.size = local_118.d.size;
        local_148.a.b.d.ptr = local_118.d.ptr;
        local_148.a.b.d.d = local_118.d.d;
        local_118.d.size = 0;
        local_148.a.a = (char (*) [6])0x2a947e;
        local_118.d.d = (Data *)0x0;
        local_118.d.ptr = (char16_t *)0x0;
        local_148.b = (char (*) [5])0x2a941c;
        QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
        convertTo<QString>((QString *)(local_278 + 0x20),&local_148);
        if (&(local_148.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_148.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_148.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_148.a.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                (&local_168,this,&pSVar5->makefile);
      qVar29 = local_168.d.size;
      rkey.super_ProString.m_string.d.size = (qsizetype)local_168.d.ptr;
      rkey.super_ProString.m_string.d.ptr = (char16_t *)local_168.d.d;
      rkey.super_ProString.m_string.d.d = (Data *)0x2aa85e;
      local_168.d.d = (Data *)0x0;
      local_168.d.ptr = (char16_t *)0x0;
      local_168.d.size = 0;
      qVar18 = local_168.d.size;
      local_168.d.size._0_4_ = (undefined4)qVar29;
      local_168.d.size._4_4_ = SUB84(qVar29,4);
      rkey.super_ProString.m_offset = (undefined4)local_168.d.size;
      rkey.super_ProString.m_length = local_168.d.size._4_4_;
      local_168.d.size = qVar18;
      QStringBuilder<const_char_(&)[5],_QString>::convertTo<QString>
                (&local_f8,(QStringBuilder<const_char_(&)[5],_QString> *)&rkey);
      if (rkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
        LOCK();
        *(int *)rkey.super_ProString.m_string.d.ptr =
             *(int *)rkey.super_ProString.m_string.d.ptr + -1;
        UNLOCK();
        if (*(int *)rkey.super_ProString.m_string.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)rkey.super_ProString.m_string.d.ptr,2,0x10);
        }
      }
      if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_168.d.d = (Data *)0x0;
      local_168.d.ptr = (char16_t *)0x0;
      local_168.d.size = 0;
      local_188.d.d = (Data *)0x0;
      local_188.d.ptr = (char16_t *)0x0;
      local_188.d.size = 0;
      if ((pSVar5->profile).d.size != 0) {
        QString::operator=(&local_168,(QString *)&pSVar5->makefile);
        local_1e8.d.d = (Data *)&rtkey;
        local_1e8.d.ptr = (char16_t *)&pSVar5->profile;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  ((QString *)&local_1c8,(QStringBuilder<QString_&,_QString_&> *)&local_1e8);
        fileFixify((QString *)local_1a8,this,(QString *)&local_1c8,(FileFixifyTypes)0x4,true);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                  (&rkey,this,(QString *)local_1a8);
        qVar29 = rkey.super_ProString.m_string.d.size;
        pDVar19 = rkey.super_ProString.m_string.d.d;
        pcVar15 = local_188.d.ptr;
        pDVar8 = local_188.d.d;
        rkey.super_ProString.m_string.d.d = local_188.d.d;
        local_188.d.d = pDVar19;
        local_188.d.ptr = rkey.super_ProString.m_string.d.ptr;
        rkey.super_ProString.m_string.d.ptr = pcVar15;
        rkey.super_ProString.m_string.d.size = local_188.d.size;
        local_188.d.size = qVar29;
        if ((Span *)pDVar8 != (Span *)0x0) {
          LOCK();
          (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_1c8.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_1c8.a.a,2,0x10);
          }
        }
        cVar21 = QString::startsWith((QString *)&local_168,(CaseSensitivity)(Data *)&rtkey);
        if (cVar21 != '\0') {
          QString::mid((longlong)&rkey,(longlong)&local_168);
          qVar29 = rkey.super_ProString.m_string.d.size;
          pDVar19 = rkey.super_ProString.m_string.d.d;
          pcVar15 = local_168.d.ptr;
          pDVar8 = local_168.d.d;
          rkey.super_ProString.m_string.d.d = local_168.d.d;
          local_168.d.d = pDVar19;
          local_168.d.ptr = rkey.super_ProString.m_string.d.ptr;
          rkey.super_ProString.m_string.d.ptr = pcVar15;
          rkey.super_ProString.m_string.d.size = local_168.d.size;
          local_168.d.size = qVar29;
          if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)pDVar8 !=
              (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
            LOCK();
            *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)->a
                 = *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                            &pDVar8->super_QArrayData)->a + -1;
            UNLOCK();
            if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)
                         ->a == 0) {
              QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
            }
          }
        }
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&rkey,this,&local_168);
        qVar29 = rkey.super_ProString.m_string.d.size;
        pDVar19 = rkey.super_ProString.m_string.d.d;
        pcVar15 = local_168.d.ptr;
        pDVar8 = local_168.d.d;
        rkey.super_ProString.m_string.d.d = local_168.d.d;
        local_168.d.d = pDVar19;
        local_168.d.ptr = rkey.super_ProString.m_string.d.ptr;
        rkey.super_ProString.m_string.d.ptr = pcVar15;
        rkey.super_ProString.m_string.d.size = local_168.d.size;
        local_168.d.size = qVar29;
        if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)pDVar8 !=
            (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
          LOCK();
          *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)->a =
               *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)
                        ->a + -1;
          UNLOCK();
          if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)->
                       a == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
        pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)&pSVar5->target);
        QTextStream::operator<<(pQVar24,"-qmake_all: ");
        if ((in_ECX & 2) == 0) {
          if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
            local_1a8._0_8_ = (QArrayData *)0x0;
            local_1a8._8_8_ = (QMakeProject *)0x0;
            local_1a8._16_8_ = 0;
            QVar50.m_data = (storage_type *)0xb;
            QVar50.m_size = (qsizetype)&rkey;
            QString::fromUtf8(QVar50);
            local_1c8.a.a = (QString *)rkey.super_ProString.m_string.d.d;
            local_1c8.a.b = (char (*) [2])rkey.super_ProString.m_string.d.ptr;
            local_1c8.b = (QString *)rkey.super_ProString.m_string.d.size;
            QVar51.m_data = (storage_type *)0xa;
            QVar51.m_size = (qsizetype)&rkey;
            pMVar35 = (MakefileGenerator *)0xa;
            QString::fromUtf8(QVar51);
            local_1e8.d.d = rkey.super_ProString.m_string.d.d;
            local_1e8.d.ptr = rkey.super_ProString.m_string.d.ptr;
            local_1e8.d.size = rkey.super_ProString.m_string.d.size;
            valGlue((QString *)&rkey,pMVar35,&pSVar5->depends,(QString *)local_1a8,
                    (QString *)&local_1c8,&local_1e8);
            QTextStream::operator<<(t,(QString *)&rkey);
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Data *)local_1e8.d.d != (Data *)0x0) {
              LOCK();
              (((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
              super___atomic_base<int>._M_i =
                   (((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_1c8.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_1c8.a.a,2,0x10);
              }
            }
            if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
              }
            }
          }
        }
        else if (uVar38 != 0) {
          pQVar24 = (QTextStream *)
                    QTextStream::operator<<(t,(QString *)&(this_00->d).ptr[uVar38 - 1]->target);
          QTextStream::operator<<(pQVar24,"-qmake_all");
        }
        QTextStream::operator<<(t," FORCE\n\t");
        if (rtkey.super_ProString.m_string.d.size != 0) {
          mkdir_p_asstring((QString *)&rkey,this,(QString *)&moved,true);
          pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)&rkey);
          QTextStream::operator<<(pQVar24,(QString *)(local_278 + 0x20));
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        pQVar24 = (QTextStream *)QTextStream::operator<<(t,"$(QMAKE) -o ");
        pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)&local_168);
        pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,' ');
        pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)(local_1a8 + 0x20));
        buildArgs((QString *)&rkey,this,false);
        QTextStream::operator<<(pQVar24,(QString *)&rkey);
        if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar20) {
          Qt::endl(t);
        }
        else {
          local_1a8._0_8_ = &local_f8;
          local_1a8._8_8_ = " qmake_all";
          QStringBuilder<QString_&,_const_char_(&)[11]>::convertTo<QString>
                    ((QString *)&rkey,(QStringBuilder<QString_&,_const_char_(&)[11]> *)local_1a8);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[8])
                    (this,t,local_278 + 0x20,&rkey);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      pQVar33 = &pSVar5->target;
      pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar33);
      QTextStream::operator<<(pQVar24,":");
      rkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      rkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      rkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[10])(&rkey,this);
      if (rkey.super_ProString.m_string.d.size != 0) {
        pQVar24 = (QTextStream *)QTextStream::operator<<(t," ");
        valList((QString *)local_1a8,this,(ProStringList *)&rkey);
        QTextStream::operator<<(pQVar24,(QString *)local_1a8);
        if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
          }
        }
      }
      if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
        pQVar24 = (QTextStream *)QTextStream::operator<<(t," ");
        valList((QString *)local_1a8,this,&pSVar5->depends);
        QTextStream::operator<<(pQVar24,(QString *)local_1a8);
        if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
          }
        }
      }
      QTextStream::operator<<(t," FORCE");
      writeSubTargetCall(this,t,(QString *)&rtkey,(QString *)(local_1a8 + 0x20),(QString *)&moved,
                         &local_168,(QString *)(local_278 + 0x20),&local_f8);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&rkey);
      if (local_88.size != 0) {
        uVar37 = 0;
        do {
          local_1a8._0_8_ = local_88.ptr[uVar37].d.d;
          local_1a8._8_8_ = local_88.ptr[uVar37].d.ptr;
          local_1a8._16_8_ = local_88.ptr[uVar37].d.size;
          if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          bVar22 = comparesEqual((QString *)local_1a8,"install_subtargets");
          if (bVar22) {
            pcVar32 = "-install";
LAB_0017b7cf:
            QVar52.m_size = pcVar32 + 1;
            QVar52.field_0.m_data = local_1a8;
            QString::assign(QVar52);
          }
          else {
            bVar22 = comparesEqual((QString *)local_1a8,"uninstall_subtargets");
            if (bVar22) {
              pcVar32 = ".uninstall";
              goto LAB_0017b7cf;
            }
            bVar22 = comparesEqual((QString *)local_1a8,"make_first");
            uVar17 = local_1a8._0_8_;
            if (bVar22) {
              local_1a8._0_8_ = (QArrayData *)0x0;
              local_1a8._8_8_ = (QMakeProject *)0x0;
              local_1a8._16_8_ = 0;
              if ((QArrayData *)uVar17 != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar17)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)uVar17,2,0x10);
                }
              }
            }
          }
          pQVar4 = this->project;
          QVar53.m_data = (storage_type *)0x9;
          QVar53.m_size = (qsizetype)&rkey;
          QString::fromUtf8(QVar53);
          pDVar8 = rkey.super_ProString.m_string.d.d;
          config_00.m_data = rkey.super_ProString.m_string.d.ptr;
          config_00.m_size = rkey.super_ProString.m_string.d.size;
          bVar22 = QMakeEvaluator::isActiveConfig(&pQVar4->super_QMakeEvaluator,config_00,false);
          if (bVar22) {
            bVar22 = comparesEqual((QString *)local_1a8,"install");
            if (pDVar8 != (Data *)0x0) {
              LOCK();
              (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
              }
            }
            t = (QTextStream *)pSVar36;
            if (bVar22) {
              if (local_388 == (default_delete<SequentialInstallData> *)0x0) {
                local_388 = (default_delete<SequentialInstallData> *)operator_new(0x40);
                *(undefined8 *)local_388 = 0;
                *(char16_t **)(local_388 + 8) = (char16_t *)0x0;
                *(qsizetype *)(local_388 + 0x10) = 0;
                *(undefined8 *)(local_388 + 0x18) = 0;
                *(char16_t **)(local_388 + 0x20) = (char16_t *)0x0;
                *(qsizetype *)(local_388 + 0x28) = 0;
                QTextStream::QTextStream((QTextStream *)(local_388 + 0x30),local_388 + 0x18,3);
              }
              rkey.super_ProString.m_string.d.ptr =
                   (char16_t *)CONCAT71(rkey.super_ProString.m_string.d.ptr._1_7_,0x2d);
              rkey.super_ProString.m_string.d.d = (Data *)pQVar33;
              ::operator+=((QString *)local_388,(QStringBuilder<QString_&,_char> *)&rkey);
              local_1c8.a.a = &local_f8;
              local_1c8.a.b = (char (*) [2])0x2adf3e;
              local_1c8.b = (QString *)local_1a8;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
              convertTo<QString>((QString *)&rkey,&local_1c8);
              writeSubTargetCall(this,(QTextStream *)(local_388 + 0x30),(QString *)&rtkey,
                                 (QString *)(local_1a8 + 0x20),(QString *)&moved,&local_168,
                                 (QString *)(local_278 + 0x20),(QString *)&rkey);
              if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
                LOCK();
                ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              lVar41 = *(long *)(local_388 + 0x28);
              t = (QTextStream *)pSVar36;
              if (lVar41 != 0) {
                do {
                  if (((*(char16_t **)(local_388 + 0x20))[lVar41 + -1] != L'\r') &&
                     (t = (QTextStream *)pSVar36,
                     (*(char16_t **)(local_388 + 0x20))[lVar41 + -1] != L'\n')) break;
                  QString::chop((longlong)(local_388 + 0x18));
                  lVar41 = *(long *)(local_388 + 0x28);
                  t = (QTextStream *)pSVar36;
                } while (lVar41 != 0);
              }
            }
          }
          else {
            t = (QTextStream *)pSVar36;
            if (pDVar8 != (Data *)0x0) {
              LOCK();
              (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                t = (QTextStream *)pSVar36;
              }
            }
          }
          pSVar36 = (SequentialInstallData *)t;
          if ((in_ECX & 2) != 0) {
            pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar33);
            pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,"-");
            pQVar24 = (QTextStream *)
                      QTextStream::operator<<(pQVar24,(QString *)(local_88.ptr + uVar37));
            QTextStream::operator<<(pQVar24,"-ordered:");
            if (uVar38 != 0) {
              pQVar24 = (QTextStream *)QTextStream::operator<<(t," ");
              pQVar24 = (QTextStream *)
                        QTextStream::operator<<
                                  (pQVar24,(QString *)&(this_00->d).ptr[uVar38 - 1]->target);
              pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,"-");
              pQVar24 = (QTextStream *)
                        QTextStream::operator<<(pQVar24,(QString *)(local_88.ptr + uVar37));
              QTextStream::operator<<(pQVar24,"-ordered ");
            }
            QTextStream::operator<<(t," FORCE");
            local_1c8.a.a = &local_f8;
            local_1c8.a.b = (char (*) [2])0x2adf3e;
            local_1c8.b = (QString *)local_1a8;
            QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
            convertTo<QString>((QString *)&rkey,&local_1c8);
            writeSubTargetCall(this,t,(QString *)&rtkey,(QString *)(local_1a8 + 0x20),
                               (QString *)&moved,&local_168,(QString *)(local_278 + 0x20),
                               (QString *)&rkey);
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar33);
          pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,"-");
          pQVar24 = (QTextStream *)
                    QTextStream::operator<<(pQVar24,(QString *)(local_88.ptr + uVar37));
          QTextStream::operator<<(pQVar24,":");
          if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
            pQVar24 = (QTextStream *)QTextStream::operator<<(t," ");
            local_1c8.a.a = (QString *)0x0;
            local_1c8.a.b = (char (*) [2])0x0;
            local_1c8.b = (QString *)0x0;
            local_208.a.b = local_88.ptr + uVar37;
            local_208.a.a = (char (*) [2])0x2aa61f;
            local_208.b = (char (*) [2])0x2adf3e;
            QStringBuilder<QStringBuilder<const_char_(&)[2],_const_QString_&>,_const_char_(&)[2]>::
            convertTo<QString>(&local_1e8,&local_208);
            local_278._8_8_ = local_88.ptr + uVar37;
            local_278._0_8_ = "-";
            pMVar35 = (MakefileGenerator *)local_278;
            QStringBuilder<const_char_(&)[2],_const_QString_&>::convertTo<QString>
                      (&local_228,(QStringBuilder<const_char_(&)[2],_const_QString_&> *)pMVar35);
            valGlue((QString *)&rkey,pMVar35,&pSVar5->depends,(QString *)&local_1c8,&local_1e8,
                    &local_228);
            QTextStream::operator<<(pQVar24,(QString *)&rkey);
            t = (QTextStream *)pSVar36;
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                t = (QTextStream *)pSVar36;
              }
            }
            if ((QMakeLocalFileName *)local_228.d.d != (QMakeLocalFileName *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i
                   = ((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)
                     ->_M_i + -1;
              UNLOCK();
              if (((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->
                  _M_i == 0) {
                QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
              }
            }
            pSVar36 = (SequentialInstallData *)t;
            if ((Data *)local_1e8.d.d != (Data *)0x0) {
              LOCK();
              (((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
              super___atomic_base<int>._M_i =
                   (((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_1c8.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_1c8.a.a,2,0x10);
              }
            }
          }
          QTextStream::operator<<(t," FORCE");
          local_1c8.a.a = &local_f8;
          local_1c8.a.b = (char (*) [2])0x2adf3e;
          local_1c8.b = (QString *)local_1a8;
          QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
          convertTo<QString>((QString *)&rkey,&local_1c8);
          writeSubTargetCall(this,t,(QString *)&rtkey,(QString *)(local_1a8 + 0x20),
                             (QString *)&moved,&local_168,(QString *)(local_278 + 0x20),
                             (QString *)&rkey);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
            }
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 < (ulong)local_88.size);
      }
      if ((Span *)local_188.d.d != (Span *)0x0) {
        LOCK();
        ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)local_168.d.d
          != (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
        LOCK();
        *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&(local_168.d.d)->super_QArrayData
                 )->a =
             *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                      &(local_168.d.d)->super_QArrayData)->a + -1;
        UNLOCK();
        if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                     &(local_168.d.d)->super_QArrayData)->a == 0) {
          QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((Data *)local_258.a.a != (Data *)0x0) {
        LOCK();
        (((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i =
             (((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_258.a.a,2,0x10);
        }
      }
      if (moved.d != (Data *)0x0) {
        LOCK();
        ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
        }
      }
      if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 < (ulong)(this_00->d).size);
  }
  Qt::endl(t);
  if (local_388 != (default_delete<SequentialInstallData> *)0x0) {
    pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_388);
    pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,"install: FORCE");
    pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)(local_388 + 0x18));
    pQVar24 = (QTextStream *)Qt::endl(pQVar24);
    Qt::endl(pQVar24);
  }
  if ((in_ECX & 8) == 0) {
    writeMakeQmake(this,t,true);
    QTextStream::operator<<(t,"qmake_all:");
    if ((this_00->d).size != 0) {
      iVar25 = QList<MakefileGenerator::SubTarget_*>::begin(this_00);
      iVar26 = QList<MakefileGenerator::SubTarget_*>::end(this_00);
      if (iVar25.i != iVar26.i) {
        do {
          if (((*iVar25.i)->profile).d.size != 0) {
            pQVar24 = (QTextStream *)QTextStream::operator<<(t," ");
            pQVar24 = (QTextStream *)
                      QTextStream::operator<<(pQVar24,(QString *)&(*iVar25.i)->target);
            QTextStream::operator<<(pQVar24,"-qmake_all");
          }
          iVar25.i = iVar25.i + 1;
          iVar26 = QList<MakefileGenerator::SubTarget_*>::end(this_00);
        } while (iVar25.i != iVar26.i);
      }
    }
    QTextStream::operator<<(t," FORCE\n\n");
  }
  if (local_88.size != 0) {
    uVar38 = 0;
    do {
      moved.d = (Data *)local_88.ptr[uVar38].d.d;
      pQStack_360 = (QMakeLocalFileName *)local_88.ptr[uVar38].d.ptr;
      local_358 = (ProString *)local_88.ptr[uVar38].d.size;
      if (moved.d != (Data *)0x0) {
        LOCK();
        ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((in_ECX & 1) == 0) {
        QVar54.m_data = (storage_type *)0x7;
        QVar54.m_size = (qsizetype)&rkey.super_ProString;
        QString::fromUtf8(QVar54);
        local_f8.d.d = rkey.super_ProString.m_string.d.d;
        local_f8.d.ptr = rkey.super_ProString.m_string.d.ptr;
        local_f8.d.size = rkey.super_ProString.m_string.d.size;
        cVar21 = QString::endsWith((QString *)&moved,(CaseSensitivity)&local_f8);
      }
      else {
        cVar21 = '\0';
      }
      if (((in_ECX & 1) == 0) && (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar21 == '\0') {
        pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar36,(QString *)&moved);
        QTextStream::operator<<(pQVar24,":");
        pSVar62 = pSVar36;
        if ((this_00->d).size != 0) {
          uVar37 = 0;
          do {
            pSVar5 = (this_00->d).ptr[uVar37];
            pQVar4 = this->project;
            rtkey.super_ProString.m_string.d.ptr = L".CONFIG";
            rtkey.super_ProString.m_string.d.d = (Data *)pSVar5;
            ProString::ProString<QString&,char_const(&)[8]>
                      (&rkey.super_ProString,(QStringBuilder<QString_&,_const_char_(&)[8]> *)&rtkey)
            ;
            pQVar27 = &QMakeEvaluator::valuesRef
                                 (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString)->
                       super_QList<ProString>;
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            bVar20 = comparesEqual((QString *)&moved,"make_first");
            if (((!bVar20) ||
                (qVar29 = QtPrivate::indexOf<ProString,char[18]>
                                    (pQVar27,(char (*) [18])"no_default_target",0), qVar29 == -1))
               && (((bVar20 = comparesEqual((QString *)&moved,"install_subtargets"), !bVar20 &&
                    (bVar20 = comparesEqual((QString *)&moved,"uninstall_subtargets"), !bVar20)) ||
                   (qVar29 = QtPrivate::indexOf<ProString,char[19]>
                                       (pQVar27,(char (*) [19])"no_default_install",0), qVar29 == -1
                   )))) {
              rkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              rkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              rkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_string.d.d = (Data *)&pSVar5->target;
              rtkey.super_ProString.m_string.d.ptr = L"-";
              rtkey.super_ProString.m_string.d.size = (qsizetype)&moved;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
              convertTo<QString>(&rkey.super_ProString.m_string,
                                 (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>
                                  *)&rtkey);
              if ((in_ECX & 2) != 0) {
                QString::append(&rkey.super_ProString,"-ordered",8);
              }
              pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62," ");
              QTextStream::operator<<(pQVar24,(QString *)&rkey.super_ProString);
              if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
                LOCK();
                ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            uVar37 = uVar37 + 1;
          } while (uVar37 < (ulong)(this_00->d).size);
        }
        bVar20 = comparesEqual((QString *)&moved,"all");
        if ((bVar20) || (bVar20 = comparesEqual((QString *)&moved,"make_first"), bVar20)) {
          pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62,' ');
          ProKey::ProKey((ProKey *)&rkey.super_ProString,"ALL_DEPS");
          depVar((QString *)&rtkey,this,(ProKey *)&rkey.super_ProString);
          QTextStream::operator<<(pQVar24,(QString *)&rtkey);
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        bVar20 = comparesEqual((QString *)&moved,"clean");
        if (bVar20) {
          pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62,' ');
          ProKey::ProKey((ProKey *)&rkey.super_ProString,"CLEAN_DEPS");
          depVar((QString *)&rtkey,this,(ProKey *)&rkey.super_ProString);
          QTextStream::operator<<(pQVar24,(QString *)&rtkey);
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
joined_r0x0017c5b4:
          if (&(rkey.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          bVar20 = comparesEqual((QString *)&moved,"distclean");
          if (bVar20) {
            pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62,' ');
            ProKey::ProKey((ProKey *)&rkey.super_ProString,"DISTCLEAN_DEPS");
            depVar((QString *)&rtkey,this,(ProKey *)&rkey.super_ProString);
            QTextStream::operator<<(pQVar24,(QString *)&rtkey);
            if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            goto joined_r0x0017c5b4;
          }
        }
        pSVar36 = pSVar62;
        QTextStream::operator<<((QTextStream *)pSVar62," FORCE\n");
        bVar20 = comparesEqual((QString *)&moved,"clean");
        if (bVar20) {
          ProKey::ProKey((ProKey *)&rkey.super_ProString,"QMAKE_CLEAN");
          QVar55.m_data = (storage_type *)0xe;
          QVar55.m_size = (qsizetype)&rtkey;
          QString::fromUtf8(QVar55);
          local_258.a.a = (char (*) [6])rtkey.super_ProString.m_string.d.d;
          local_258.a.b.d.d = (Data *)rtkey.super_ProString.m_string.d.ptr;
          local_258.a.b.d.ptr = (char16_t *)rtkey.super_ProString.m_string.d.size;
          QVar56.m_data = (storage_type *)0xf;
          QVar56.m_size = (qsizetype)&rtkey;
          QString::fromUtf8(QVar56);
          local_168.d.d = rtkey.super_ProString.m_string.d.d;
          local_168.d.ptr = rtkey.super_ProString.m_string.d.ptr;
          local_168.d.size = rtkey.super_ProString.m_string.d.size;
          QVar57.m_data = (storage_type *)0x1;
          QVar57.m_size = (qsizetype)&rtkey;
          QString::fromUtf8(QVar57);
          local_188.d.d = rtkey.super_ProString.m_string.d.d;
          local_188.d.ptr = rtkey.super_ProString.m_string.d.ptr;
          local_188.d.size = rtkey.super_ProString.m_string.d.size;
          fixFileVarGlue((QString *)&rtkey,this,(ProKey *)&rkey.super_ProString,
                         (QString *)(local_278 + 0x20),&local_168,(QString *)(local_1a8 + 0x20));
          QTextStream::operator<<((QTextStream *)pSVar62,(QString *)&rtkey);
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
          if ((Span *)local_188.d.d != (Span *)0x0) {
            LOCK();
            ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
              local_168.d.d !=
              (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
            LOCK();
            *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                     &(local_168.d.d)->super_QArrayData)->a =
                 *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                          &(local_168.d.d)->super_QArrayData)->a + -1;
            UNLOCK();
            if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                         &(local_168.d.d)->super_QArrayData)->a == 0) {
              QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((Data *)local_258.a.a != (Data *)0x0) {
            LOCK();
            (((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i =
                 (((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((RefCount *)*local_258.a.a)->atomic)._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_258.a.a,2,0x10);
            }
          }
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            iVar2 = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i;
            UNLOCK();
            pDVar12 = (Data *)rkey.super_ProString.m_string.d.d;
joined_r0x0017ca7e:
            if (iVar2 == 0) {
              QArrayData::deallocate((QArrayData *)pDVar12,2,0x10);
            }
          }
        }
        else {
          bVar20 = comparesEqual((QString *)&moved,"distclean");
          if (bVar20) {
            local_258.a.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_258.a.a = (char (*) [6])&DAT_aaaaaaaaaaaaaaaa;
            local_258.a.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            QFile::fileName();
            fileFixify((QString *)(local_278 + 0x20),this,&rkey.super_ProString.m_string,
                       (FileFixifyTypes)0x0,true);
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((ProString *)local_258.a.b.d.ptr != (ProString *)0x0) {
              pQVar24 = (QTextStream *)
                        QTextStream::operator<<((QTextStream *)pSVar36,"\t-$(DEL_FILE) ");
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (&rkey.super_ProString,this,local_278 + 0x20);
              pQVar24 = (QTextStream *)
                        QTextStream::operator<<(pQVar24,(QString *)&rkey.super_ProString);
              Qt::endl(pQVar24);
              if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
                LOCK();
                ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            ProKey::ProKey((ProKey *)&rkey.super_ProString,"QMAKE_DISTCLEAN");
            QVar58.m_data = (storage_type *)0xe;
            QVar58.m_size = (qsizetype)&rtkey;
            QString::fromUtf8(QVar58);
            local_168.d.d = rtkey.super_ProString.m_string.d.d;
            local_168.d.ptr = rtkey.super_ProString.m_string.d.ptr;
            local_168.d.size = rtkey.super_ProString.m_string.d.size;
            QVar59.m_data = (storage_type *)0x1;
            QVar59.m_size = (qsizetype)&rtkey;
            QString::fromUtf8(QVar59);
            local_188.d.d = rtkey.super_ProString.m_string.d.d;
            local_188.d.ptr = rtkey.super_ProString.m_string.d.ptr;
            local_188.d.size = rtkey.super_ProString.m_string.d.size;
            QVar60.m_data = (storage_type *)0x1;
            QVar60.m_size = (qsizetype)&rtkey;
            QString::fromUtf8(QVar60);
            local_1a8._0_8_ = rtkey.super_ProString.m_string.d.d;
            local_1a8._8_8_ = rtkey.super_ProString.m_string.d.ptr;
            local_1a8._16_8_ = rtkey.super_ProString.m_string.d.size;
            fixFileVarGlue((QString *)&rtkey,this,(ProKey *)&rkey.super_ProString,&local_168,
                           (QString *)(local_1a8 + 0x20),(QString *)local_1a8);
            QTextStream::operator<<((QTextStream *)pSVar36,(QString *)&rtkey);
            if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
              }
            }
            if ((Span *)local_188.d.d != (Span *)0x0) {
              LOCK();
              ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                local_168.d.d !=
                (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
              LOCK();
              *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                       &(local_168.d.d)->super_QArrayData)->a =
                   *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                            &(local_168.d.d)->super_QArrayData)->a + -1;
              UNLOCK();
              if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                           &(local_168.d.d)->super_QArrayData)->a == 0) {
                QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Data *)local_258.a.a != (Data *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_258.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_258.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              iVar2 = (((QBasicAtomicInt *)*local_258.a.a)->_q_value).super___atomic_base<int>._M_i;
              UNLOCK();
              pDVar12 = (Data *)local_258.a.a;
              goto joined_r0x0017ca7e;
            }
          }
        }
      }
      if (moved.d != (Data *)0x0) {
        LOCK();
        ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
        }
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 < (ulong)local_88.size);
  }
  pQVar4 = this->project;
  ProKey::ProKey(&rkey,"QMAKE_EXTRA_TARGETS");
  pPVar23 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rkey);
  if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pPVar23->super_QList<ProString>).d.size != 0) {
    pPVar39 = (pPVar23->super_QList<ProString>).d.ptr;
    do {
      pQVar4 = this->project;
      rtkey.super_ProString.m_string.d.ptr = L".CONFIG";
      rtkey.super_ProString.m_string.d.d = (Data *)pPVar39;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&rtkey);
      pQVar27 = &QMakeEvaluator::valuesRef
                           (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString)->
                 super_QList<ProString>;
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_168.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      rtkey.super_ProString.m_string.d.ptr = L".target";
      rtkey.super_ProString.m_string.d.d = (Data *)pPVar39;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&rtkey);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                (&local_168,this,&rkey.super_ProString);
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_188.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_188.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      rtkey.super_ProString.m_string.d.ptr = L".commands";
      rtkey.super_ProString.m_string.d.d = (Data *)pPVar39;
      ProString::ProString<ProString_const&,char_const(&)[10]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&rtkey);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                (local_1a8 + 0x20,this,&rkey.super_ProString);
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_1a8._0_8_ = (QArrayData *)0x0;
      local_1a8._8_8_ = (QMakeProject *)0x0;
      local_1a8._16_8_ = 0;
      if ((QString *)local_168.d.size == (QString *)0x0) {
        ProString::toQString(&rkey.super_ProString.m_string,pPVar39);
        qVar29 = rkey.super_ProString.m_string.d.size;
        pDVar19 = rkey.super_ProString.m_string.d.d;
        pcVar15 = local_168.d.ptr;
        pDVar8 = local_168.d.d;
        rkey.super_ProString.m_string.d.d = local_168.d.d;
        pQVar9 = (QString *)local_168.d.ptr;
        pQVar10 = (QString *)local_168.d.size;
        local_168.d.d = pDVar19;
        local_168.d.ptr = rkey.super_ProString.m_string.d.ptr;
        pQVar33 = (QString *)rkey.super_ProString.m_string.d.size;
        rkey.super_ProString.m_string.d.ptr = pcVar15;
        rkey.super_ProString.m_string.d.size = local_168.d.size;
        local_168.d.size = qVar29;
        if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)pDVar8 !=
            (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
          LOCK();
          *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)->a =
               *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)
                        ->a + -1;
          UNLOCK();
          if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&pDVar8->super_QArrayData)->
                       a == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
      }
      Qt::endl((QTextStream *)pSVar36);
      pQVar4 = this->project;
      rtkey.super_ProString.m_string.d.ptr = L".depends";
      rtkey.super_ProString.m_string.d.d = (Data *)pPVar39;
      ProString::ProString<ProString_const&,char_const(&)[9]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&rtkey);
      pPVar28 = QMakeEvaluator::valuesRef
                          (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString);
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((pPVar28->super_QList<ProString>).d.size != 0) {
        pPVar40 = (pPVar28->super_QList<ProString>).d.ptr;
        do {
          pPVar14 = local_358;
          rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          moved.d = (Data *)pPVar40;
          ProString::ProString<ProString_const&,char_const(&)[8]>
                    (&rkey.super_ProString,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&moved);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                    ((QArrayDataPointer<QString> *)&rtkey,this,&rkey.super_ProString);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (rtkey.super_ProString.m_string.d.size == 0) {
            ProString::toQString(&rkey.super_ProString.m_string,pPVar40);
            qVar29 = rkey.super_ProString.m_string.d.size;
            pDVar8 = rkey.super_ProString.m_string.d.d;
            pcVar15 = rtkey.super_ProString.m_string.d.ptr;
            pDVar19 = rtkey.super_ProString.m_string.d.d;
            rtkey.super_ProString.m_string.d.ptr = rkey.super_ProString.m_string.d.ptr;
            rkey.super_ProString.m_string.d.d = rtkey.super_ProString.m_string.d.d;
            rtkey.super_ProString.m_string.d.d = pDVar8;
            rkey.super_ProString.m_string.d.ptr = pcVar15;
            rkey.super_ProString.m_string.d.size = rtkey.super_ProString.m_string.d.size;
            rtkey.super_ProString.m_string.d.size = qVar29;
            if (pDVar19 != (Data *)0x0) {
              LOCK();
              (pDVar19->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar19->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar19->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar19->super_QArrayData,2,0x10);
              }
            }
          }
          rkey.super_ProString.m_string.d.d = rtkey.super_ProString.m_string.d.d;
          rkey.super_ProString.m_string.d.ptr = rtkey.super_ProString.m_string.d.ptr;
          rkey.super_ProString.m_string.d.size = rtkey.super_ProString.m_string.d.size;
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          string.d.ptr._4_4_ = in_ECX;
          string.d._0_12_ = in_stack_fffffffffffffc38;
          string.d.size = (qsizetype)pSVar36;
          Option::fixString((QString *)&local_1c8,string,(uchar)&rkey.super_ProString);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    (&moved,this,&local_1c8);
          rkey.super_ProString.m_string.d.ptr = (char16_t *)moved;
          rkey.super_ProString.m_string.d.d =
               (Data *)CONCAT71(rkey.super_ProString.m_string.d.d._1_7_,0x20);
          moved.d = (Data *)0x0;
          pQStack_360 = (QMakeLocalFileName *)0x0;
          rkey.super_ProString.m_string.d.size = (qsizetype)anon_var_dwarf_156bee;
          local_358 = (ProString *)0x0;
          rkey.super_ProString._24_8_ = pPVar14;
          ::operator+=((QString *)local_1a8,(QStringBuilder<char,_QString> *)&rkey.super_ProString);
          if (rkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
            LOCK();
            *(int *)rkey.super_ProString.m_string.d.ptr =
                 *(int *)rkey.super_ProString.m_string.d.ptr + -1;
            UNLOCK();
            if (*(int *)rkey.super_ProString.m_string.d.ptr == 0) {
              QArrayData::deallocate((QArrayData *)rkey.super_ProString.m_string.d.ptr,2,0x10);
            }
          }
          if (moved.d != (Data *)0x0) {
            LOCK();
            ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
            }
          }
          if ((QArrayData *)local_1c8.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_1c8.a.a,2,0x10);
            }
          }
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
          pPVar40 = pPVar40 + 1;
        } while (pPVar40 !=
                 (pPVar28->super_QList<ProString>).d.ptr + (pPVar28->super_QList<ProString>).d.size)
        ;
      }
      qVar29 = QtPrivate::indexOf<ProString,char[10]>(pQVar27,(char (*) [10])0x2b4f6a,0);
      if (qVar29 != -1) {
        local_230.d = (Data *)0x0;
        rkey.super_ProString._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        rtkey.super_ProString.m_string.d.ptr = L".recurse";
        rtkey.super_ProString.m_string.d.d = (Data *)pPVar39;
        ProString::ProString<ProString_const&,char_const(&)[9]>
                  (&rkey.super_ProString,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&rtkey);
        p_Var7 = (this->project->super_QMakeEvaluator).m_valuemapStack.
                 super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                 .
                 super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        lVar41 = (long)p_Var7[1]._M_next;
        if ((lVar41 == 0) ||
           (cVar30 = std::
                     _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                     ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                             *)(lVar41 + 8),(key_type *)&rkey.super_ProString),
           cVar30._M_node == (_Base_ptr)((long)p_Var7[1]._M_next + 0x10))) {
          if ((this_00->d).size != 0) {
            uVar38 = 0;
            do {
              QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                        ((QHash<QString,QHashDummyValue> *)&local_230,
                         &(this_00->d).ptr[uVar38]->name,(QHashDummyValue *)&rtkey);
              uVar38 = uVar38 + 1;
            } while (uVar38 < (ulong)(this_00->d).size);
          }
        }
        else {
          rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pPVar28 = QMakeEvaluator::valuesRef
                              (&this->project->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString)
          ;
          ProStringList::toQStringList((QStringList *)&rtkey,pPVar28);
          qVar29 = rtkey.super_ProString.m_string.d.size;
          pQVar33 = (QString *)rtkey.super_ProString.m_string.d.ptr;
          local_1c8.a.a = (QString *)0x0;
          QHash<QString,_QHashDummyValue>::reserve
                    ((QHash<QString,_QHashDummyValue> *)&local_1c8,
                     rtkey.super_ProString.m_string.d.size);
          if (qVar29 != 0) {
            lVar41 = qVar29 * 0x18;
            do {
              QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                        ((QHash<QString,QHashDummyValue> *)&local_1c8,pQVar33,
                         (QHashDummyValue *)&moved);
              pQVar33 = pQVar33 + 1;
              lVar41 = lVar41 + -0x18;
            } while (lVar41 != 0);
          }
          pQVar33 = local_1c8.a.a;
          moved.d = local_230.d;
          local_1c8.a.a = (QString *)0x0;
          local_230.d = (Data *)pQVar33;
          QHash<QString,_QHashDummyValue>::~QHash(&moved);
          QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)&local_1c8);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&rtkey);
        }
        if ((this_00->d).size != 0) {
          uVar38 = 0;
          do {
            pPVar40 = local_358;
            pSVar5 = (this_00->d).ptr[uVar38];
            local_1c8.a.a = (QString *)(pSVar5->in_directory).d.d;
            local_1c8.a.b = (char (*) [2])(pSVar5->in_directory).d.ptr;
            local_1c8.b = (QString *)(pSVar5->in_directory).d.size;
            if ((QArrayData *)local_1c8.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((QArrayData *)local_1c8.a.a)->ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((QArrayData *)local_1c8.a.a)->ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (((Data *)local_1c8.b != (Data *)0x0) &&
               (cVar21 = QString::endsWith((QString *)&local_1c8,0x2e2bf0), cVar21 == '\0')) {
              QString::append((QString *)&local_1c8);
            }
            local_1e8.d.d = (pSVar5->out_directory).d.d;
            local_1e8.d.ptr = (pSVar5->out_directory).d.ptr;
            local_1e8.d.size = (pSVar5->out_directory).d.size;
            if ((Data *)local_1e8.d.d != (Data *)0x0) {
              LOCK();
              (((QArrayData *)&((Data *)local_1e8.d.d)->ref)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((Data *)local_1e8.d.d)->ref)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (((ProString *)local_1e8.d.size != (ProString *)0x0) &&
               (cVar21 = QString::endsWith((QString *)&local_1e8,0x2e2bf0), cVar21 == '\0')) {
              QString::append((QString *)&local_1e8);
            }
            if (((undefined1 *)local_a8.d.size != (undefined1 *)0x0) &&
               (cVar21 = QString::startsWith((QString *)&local_1e8,(CaseSensitivity)&local_a8),
               cVar21 != '\0')) {
              QString::mid((longlong)&local_208,(longlong)&local_1e8);
              rtkey.super_ProString._24_8_ = local_208.b;
              rtkey.super_ProString.m_string.d.size = (qsizetype)local_208.a.b;
              rtkey.super_ProString.m_string.d.ptr = (char16_t *)local_208.a.a;
              rtkey.super_ProString.m_string.d.d = (Data *)&Option::output_dir;
              local_208.a.a = (char (*) [2])0x0;
              local_208.a.b = (QString *)0x0;
              local_208.b = (char (*) [2])0x0;
              QStringBuilder<QString_&,_QString>::convertTo<QString>
                        ((QString *)&moved,(QStringBuilder<QString_&,_QString> *)&rtkey);
              pcVar15 = local_1e8.d.ptr;
              pDVar8 = local_1e8.d.d;
              QVar13 = moved;
              moved.d = (Data *)local_1e8.d.d;
              local_1e8.d.d = (Data *)QVar13.d;
              local_1e8.d.ptr = (char16_t *)pQStack_360;
              pQStack_360 = (QMakeLocalFileName *)pcVar15;
              local_358 = (ProString *)local_1e8.d.size;
              local_1e8.d.size = (qsizetype)pPVar40;
              if ((Data *)pDVar8 != (Data *)0x0) {
                LOCK();
                (((RefCount *)&pDVar8->super_QArrayData)->atomic)._q_value.super___atomic_base<int>.
                _M_i = (((RefCount *)&pDVar8->super_QArrayData)->atomic)._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((RefCount *)&pDVar8->super_QArrayData)->atomic)._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                }
              }
              if (rtkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
                LOCK();
                *(int *)rtkey.super_ProString.m_string.d.ptr =
                     *(int *)rtkey.super_ProString.m_string.d.ptr + -1;
                UNLOCK();
                if (*(int *)rtkey.super_ProString.m_string.d.ptr == 0) {
                  QArrayData::deallocate((QArrayData *)rtkey.super_ProString.m_string.d.ptr,2,0x10);
                }
              }
              if ((QArrayData *)local_208.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_208.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_208.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_208.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_208.a.a,2,0x10);
                }
              }
            }
            if ((local_230.d != (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) &&
               (pNVar31 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                          findNode<QString>(local_230.d,&pSVar5->name),
               pNVar31 != (Node<QString,_QHashDummyValue> *)0x0)) {
              local_208.b = (char (*) [2])&DAT_aaaaaaaaaaaaaaaa;
              local_208.a.a = (char (*) [2])&DAT_aaaaaaaaaaaaaaaa;
              local_208.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
              if ((ProString *)local_1e8.d.size == (ProString *)0x0) {
                QVar61.m_data = (storage_type *)0x2;
                QVar61.m_size = (qsizetype)&rtkey;
                QString::fromUtf8(QVar61);
                local_208.a.a = (char (*) [2])rtkey.super_ProString.m_string.d.d;
                local_208.a.b = (QString *)rtkey.super_ProString.m_string.d.ptr;
                local_208.b = (char (*) [2])rtkey.super_ProString.m_string.d.size;
              }
              else {
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&local_228,this,&local_1e8);
                local_258.a.b.d.size = local_228.d.size;
                local_258.a.b.d.ptr = local_228.d.ptr;
                local_258.a.b.d.d = local_228.d.d;
                local_228.d.size = 0;
                local_258.a.a = (char (*) [6])0x2a947e;
                local_228.d.d = (Data *)0x0;
                local_228.d.ptr = (char16_t *)0x0;
                local_258.b = (char (*) [5])0x2a941c;
                QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
                convertTo<QString>((QString *)&local_208,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                                    *)(local_278 + 0x20));
                if ((QMakeLocalFileName *)local_258.a.b.d.d != (QMakeLocalFileName *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)&(local_258.a.b.d.d)->super_QArrayData)->d).d
                  )->_M_i = ((__atomic_base<int> *)
                            &(((QString *)&(local_258.a.b.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)
                      &(((QString *)&(local_258.a.b.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                    QArrayData::deallocate(&(local_258.a.b.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeLocalFileName *)local_228.d.d != (QMakeLocalFileName *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->
                  _M_i = ((__atomic_base<int> *)
                         &(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d
                      )->_M_i == 0) {
                    QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              local_278._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_278._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (&moved,this,&pSVar5->makefile);
              rtkey.super_ProString.m_string.d.ptr = (char16_t *)moved;
              rtkey.super_ProString.m_string.d.d = (Data *)0x2aa85e;
              moved.d = (Data *)0x0;
              rtkey.super_ProString.m_string.d.size = (qsizetype)pQStack_360;
              rtkey.super_ProString._24_8_ = local_358;
              QStringBuilder<const_char_(&)[5],_QString>::convertTo<QString>
                        ((QString *)local_278,(QStringBuilder<const_char_(&)[5],_QString> *)&rtkey);
              if (rtkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
                LOCK();
                *(int *)rtkey.super_ProString.m_string.d.ptr =
                     *(int *)rtkey.super_ProString.m_string.d.ptr + -1;
                UNLOCK();
                if (*(int *)rtkey.super_ProString.m_string.d.ptr == 0) {
                  QArrayData::deallocate((QArrayData *)rtkey.super_ProString.m_string.d.ptr,2,0x10);
                }
              }
              if (moved.d != (Data *)0x0) {
                LOCK();
                ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                     ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
                }
              }
              local_298.d.d = (Data *)0x0;
              local_298.d.ptr = (char16_t *)0x0;
              local_298.d.size = 0;
              local_2b8.d.d = (Data *)0x0;
              local_2b8.d.ptr = (char16_t *)0x0;
              local_2b8.d.size = 0;
              if ((pSVar5->profile).d.size != 0) {
                QString::operator=(&local_298,(QString *)&pSVar5->makefile);
                local_2f8.a.a = (QString *)&local_1c8;
                local_2f8.a.b = (char (*) [2])&pSVar5->profile;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          (&local_2d8,(QStringBuilder<QString_&,_QString_&> *)&local_2f8);
                fileFixify((QString *)&moved,this,&local_2d8,(FileFixifyTypes)0x4,true);
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&rtkey,this,(QString *)&moved);
                qVar29 = rtkey.super_ProString.m_string.d.size;
                pDVar19 = rtkey.super_ProString.m_string.d.d;
                pcVar15 = local_2b8.d.ptr;
                pDVar8 = local_2b8.d.d;
                rtkey.super_ProString.m_string.d.d = local_2b8.d.d;
                local_2b8.d.d = pDVar19;
                local_2b8.d.ptr = rtkey.super_ProString.m_string.d.ptr;
                rtkey.super_ProString.m_string.d.ptr = pcVar15;
                rtkey.super_ProString.m_string.d.size = local_2b8.d.size;
                local_2b8.d.size = qVar29;
                if ((Data *)pDVar8 != (Data *)0x0) {
                  LOCK();
                  (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                  }
                }
                if (moved.d != (Data *)0x0) {
                  LOCK();
                  ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                       ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
                  }
                }
                if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                    local_2d8.d.d !=
                    (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0)
                {
                  LOCK();
                  *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                           &(local_2d8.d.d)->super_QArrayData)->a =
                       *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                                &(local_2d8.d.d)->super_QArrayData)->a + -1;
                  UNLOCK();
                  if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                               &(local_2d8.d.d)->super_QArrayData)->a == 0) {
                    QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                cVar21 = QString::startsWith((QString *)&local_298,(CaseSensitivity)&local_1c8);
                if (cVar21 != '\0') {
                  QString::mid((longlong)&rtkey,(longlong)&local_298);
                  qVar29 = rtkey.super_ProString.m_string.d.size;
                  pDVar19 = rtkey.super_ProString.m_string.d.d;
                  pcVar15 = local_298.d.ptr;
                  pDVar8 = local_298.d.d;
                  rtkey.super_ProString.m_string.d.d = local_298.d.d;
                  local_298.d.d = pDVar19;
                  local_298.d.ptr = rtkey.super_ProString.m_string.d.ptr;
                  rtkey.super_ProString.m_string.d.ptr = pcVar15;
                  rtkey.super_ProString.m_string.d.size = local_298.d.size;
                  local_298.d.size = qVar29;
                  if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                    }
                  }
                }
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&rtkey,this,&local_298);
                qVar29 = rtkey.super_ProString.m_string.d.size;
                pDVar19 = rtkey.super_ProString.m_string.d.d;
                pcVar15 = local_298.d.ptr;
                pDVar8 = local_298.d.d;
                rtkey.super_ProString.m_string.d.d = local_298.d.d;
                local_298.d.d = pDVar19;
                local_298.d.ptr = rtkey.super_ProString.m_string.d.ptr;
                rtkey.super_ProString.m_string.d.ptr = pcVar15;
                rtkey.super_ProString.m_string.d.size = local_298.d.size;
                local_298.d.size = qVar29;
                if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                  }
                }
              }
              if ((in_ECX & 2) == 0) {
                rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                moved.d = (Data *)&pSVar5->target;
                QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>::
                convertTo<QString>((QString *)&rtkey,
                                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>
                                    *)&moved);
                pQVar24 = (QTextStream *)
                          QTextStream::operator<<((QTextStream *)pSVar36,(QString *)&rtkey);
                QTextStream::operator<<(pQVar24,":");
                if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
                  pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar36," ");
                  local_2d8.d.d = (Data *)0x0;
                  local_2d8.d.ptr = (char16_t *)0x0;
                  local_2d8.d.size = 0;
                  local_310.a.a = (char (*) [2])0x2aa61f;
                  local_310.b = (char (*) [2])0x2adf3e;
                  local_310.a.b = pPVar39;
                  QStringBuilder<QStringBuilder<const_char_(&)[2],_const_ProString_&>,_const_char_(&)[2]>
                  ::convertTo<QString>((QString *)&local_2f8,&local_310);
                  local_338._0_8_ = "-";
                  pMVar35 = (MakefileGenerator *)local_338;
                  local_338._8_8_ = pPVar39;
                  QStringBuilder<const_char_(&)[2],_const_ProString_&>::convertTo<QString>
                            ((QString *)(local_338 + 0x10),
                             (QStringBuilder<const_char_(&)[2],_const_ProString_&> *)pMVar35);
                  valGlue((QString *)&moved,pMVar35,&pSVar5->depends,&local_2d8,
                          (QString *)&local_2f8,(QString *)(local_338 + 0x10));
                  QTextStream::operator<<(pQVar24,(QString *)&moved);
                  if (moved.d != (Data *)0x0) {
                    LOCK();
                    ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                         ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_338._16_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_338._16_8_)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)local_338._16_8_)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_338._16_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_338._16_8_,2,0x10);
                    }
                  }
                  if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                      local_2f8.a.a !=
                      (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0
                     ) {
                    LOCK();
                    *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&(local_2f8.a.a)->d)->
                             a = *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                                          &(local_2f8.a.a)->d)->a + -1;
                    UNLOCK();
                    if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                                 &(local_2f8.a.a)->d)->a == 0) {
                      QArrayData::deallocate((QArrayData *)local_2f8.a.a,2,0x10);
                    }
                  }
                  if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                      local_2d8.d.d !=
                      (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0
                     ) {
                    LOCK();
                    *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                             &(local_2d8.d.d)->super_QArrayData)->a =
                         *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                                  &(local_2d8.d.d)->super_QArrayData)->a + -1;
                    UNLOCK();
                    if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                                 &(local_2d8.d.d)->super_QArrayData)->a == 0) {
                      QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                moved.d = (Data *)0x2adf3e;
                ::operator+=((QString *)local_1a8,
                             (QStringBuilder<const_char_(&)[2],_const_QString_&> *)&moved);
                local_358 = pPVar39;
                if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
                  LOCK();
                  ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              else {
                local_358 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
                moved.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.ptr = L"-";
                rtkey.super_ProString._24_8_ = anon_var_dwarf_158118;
                rtkey.super_ProString.m_string.d.d = (Data *)&pSVar5->target;
                rtkey.super_ProString.m_string.d.size = (qsizetype)pPVar39;
                QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[9]>
                ::convertTo<QString>
                          ((QString *)&moved,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[9]>
                            *)&rtkey);
                pSVar62 = pSVar36;
                pQVar24 = (QTextStream *)
                          QTextStream::operator<<((QTextStream *)pSVar36,(QString *)&moved);
                QTextStream::operator<<(pQVar24,":");
                if (uVar38 != 0) {
                  pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar36," ");
                  pQVar24 = (QTextStream *)
                            QTextStream::operator<<
                                      (pQVar24,(QString *)&(this_00->d).ptr[uVar38 - 1]->target);
                  pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,"-");
                  pQVar24 = operator<<(pQVar24,pPVar39);
                  QTextStream::operator<<(pQVar24,"_ordered ");
                }
                pSVar36 = pSVar62;
                rtkey.super_ProString.m_string.d.d = (Data *)0x2adf3e;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)&moved;
                ::operator+=((QString *)local_1a8,
                             (QStringBuilder<const_char_(&)[2],_const_QString_&> *)&rtkey);
                if (moved.d != (Data *)0x0) {
                  LOCK();
                  ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                       ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
                  }
                }
              }
              local_2d8.d.d = local_168.d.d;
              local_2d8.d.ptr = local_168.d.ptr;
              local_2d8.d.size = local_168.d.size;
              if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                  local_168.d.d !=
                  (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
                LOCK();
                *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                         &(local_168.d.d)->super_QArrayData)->a =
                     *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                              &(local_168.d.d)->super_QArrayData)->a + 1;
                UNLOCK();
              }
              rtkey.super_ProString._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              rtkey.super_ProString._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              pQStack_360 = (QMakeLocalFileName *)0x2a954b;
              moved.d = (Data *)pPVar39;
              ProString::ProString<ProString_const&,char_const(&)[16]>
                        (&rtkey.super_ProString,
                         (QStringBuilder<const_ProString_&,_const_char_(&)[16]> *)&moved);
              p_Var7 = (this->project->super_QMakeEvaluator).m_valuemapStack.
                       super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       .
                       super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
              lVar41 = (long)p_Var7[1]._M_next;
              if ((lVar41 != 0) &&
                 (cVar30 = std::
                           _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                           ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                                   *)(lVar41 + 8),&rtkey),
                 cVar30._M_node != (_Base_ptr)((long)p_Var7[1]._M_next + 0x10))) {
                QMakeEvaluator::first
                          ((ProString *)&moved,&this->project->super_QMakeEvaluator,&rtkey);
                ProString::toQString((QString *)&local_2f8,(ProString *)&moved);
                pcVar15 = local_2d8.d.ptr;
                pDVar8 = local_2d8.d.d;
                pQVar9 = local_2f8.b;
                pQVar33 = local_2f8.a.a;
                local_2f8.a.a = (QString *)local_2d8.d.d;
                local_2d8.d.d = (Data *)pQVar33;
                local_2d8.d.ptr = (char16_t *)local_2f8.a.b;
                local_2f8.a.b = (char (*) [2])pcVar15;
                local_2f8.b = (QString *)local_2d8.d.size;
                local_2d8.d.size = (qsizetype)pQVar9;
                if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                    pDVar8 != (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>
                               *)0x0) {
                  LOCK();
                  *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                           &pDVar8->super_QArrayData)->a =
                       *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                                &pDVar8->super_QArrayData)->a + -1;
                  UNLOCK();
                  if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                               &pDVar8->super_QArrayData)->a == 0) {
                    QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                  }
                }
                if (moved.d != (Data *)0x0) {
                  LOCK();
                  ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                       ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
                  }
                }
              }
              local_2f8.a.a = (QString *)local_278;
              local_2f8.a.b = (char (*) [2])0x2adf3e;
              local_2f8.b = &local_2d8;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
              convertTo<QString>((QString *)&moved,&local_2f8);
              writeSubTargetCall(this,(QTextStream *)pSVar36,(QString *)&local_1c8,&local_2b8,
                                 &local_1e8,&local_298,(QString *)&local_208,(QString *)&moved);
              if (moved.d != (Data *)0x0) {
                LOCK();
                ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                     ((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((moved.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)moved.d,2,0x10);
                }
              }
              if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
                LOCK();
                ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                  local_2d8.d.d !=
                  (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
                LOCK();
                *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                         &(local_2d8.d.d)->super_QArrayData)->a =
                     *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                              &(local_2d8.d.d)->super_QArrayData)->a + -1;
                UNLOCK();
                if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                             &(local_2d8.d.d)->super_QArrayData)->a == 0) {
                  QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((Data *)local_2b8.d.d != (Data *)0x0) {
                LOCK();
                ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_298.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((Data *)local_278._0_8_ != (Data *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_208.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_208.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_208.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_208.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_208.a.a,2,0x10);
                }
              }
            }
            if ((Data *)local_1e8.d.d != (Data *)0x0) {
              LOCK();
              (((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
              super___atomic_base<int>._M_i =
                   (((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((RefCount *)&(local_1e8.d.d)->super_QArrayData)->atomic)._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_1c8.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_1c8.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_1c8.a.a,2,0x10);
              }
            }
            uVar38 = uVar38 + 1;
          } while (uVar38 < (ulong)(this_00->d).size);
        }
        if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QHash<QString,_QHashDummyValue>::~QHash(&local_230);
      }
      qVar29 = QtPrivate::indexOf<ProString,char[6]>(pQVar27,(char (*) [6])"phony",0);
      if (qVar29 != -1) {
        QString::append(local_1a8," FORCE",6);
      }
      rkey.super_ProString.m_string.d.d = local_168.d.d;
      rkey.super_ProString.m_string.d.ptr = local_168.d.ptr;
      rkey.super_ProString.m_string.d.size = local_168.d.size;
      if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)local_168.d.d
          != (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
        LOCK();
        *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&(local_168.d.d)->super_QArrayData
                 )->a =
             *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                      &(local_168.d.d)->super_QArrayData)->a + 1;
        UNLOCK();
      }
      string_00.d.ptr._4_4_ = in_ECX;
      string_00.d._0_12_ = in_stack_fffffffffffffc38;
      string_00.d.size = (qsizetype)pSVar36;
      Option::fixString((QString *)&rtkey,string_00,(uchar)&rkey);
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&rkey,this,&rtkey);
      pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar36,(QString *)&rkey);
      pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,":");
      pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)local_1a8);
      QTextStream::operator<<(pQVar24,"\n");
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((undefined1 *)local_188.d.size != (undefined1 *)0x0) {
        pQVar24 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar36,"\t");
        pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)(local_1a8 + 0x20));
        Qt::endl(pQVar24);
      }
      if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
        }
      }
      if ((Span *)local_188.d.d != (Span *)0x0) {
        LOCK();
        ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)local_168.d.d
          != (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)0x0) {
        LOCK();
        *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)&(local_168.d.d)->super_QArrayData
                 )->a =
             *(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                      &(local_168.d.d)->super_QArrayData)->a + -1;
        UNLOCK();
        if (*(int *)&((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                     &(local_168.d.d)->super_QArrayData)->a == 0) {
          QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
        }
      }
      pPVar39 = pPVar39 + 1;
    } while (pPVar39 !=
             (pPVar23->super_QList<ProString>).d.ptr + (pPVar23->super_QList<ProString>).d.size);
  }
  if ((in_ECX & 1) != 0) {
    ProString::ProString(&rkey.super_ProString,"install_subtargets");
    pQVar4 = this->project;
    ProKey::ProKey(&rtkey,"INSTALLDEPS");
    pQVar27 = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rtkey)->
               super_QList<ProString>;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar27,(pQVar27->d).size,&rkey.super_ProString);
    QList<ProString>::end(pQVar27);
    if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
      ._M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProString::ProString(&rkey.super_ProString,"uninstall_subtargets");
    pQVar4 = this->project;
    ProKey::ProKey(&rtkey,"UNINSTALLDEPS");
    pQVar27 = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rtkey)->
               super_QList<ProString>;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar27,(pQVar27->d).size,&rkey.super_ProString);
    QList<ProString>::end(pQVar27);
    if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
      ._M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    writeInstalls(this,(QTextStream *)pSVar36,true);
  }
  QTextStream::operator<<((QTextStream *)pSVar36,"FORCE:\n\n");
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[7])(this);
  if (local_388 != (default_delete<SequentialInstallData> *)0x0) {
    std::default_delete<SequentialInstallData>::operator()(local_388,pSVar36);
  }
  piVar11 = (int *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_),2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    // blasted includes
    const ProStringList &qeui = project->values("QMAKE_EXTRA_INCLUDES");
    for (ProStringList::ConstIterator qeui_it = qeui.begin(); qeui_it != qeui.end(); ++qeui_it)
        t << "include " << (*qeui_it) << Qt::endl;

    if (!(flags & SubTargetSkipDefaultVariables)) {
        writeDefaultVariables(t);
        t << "SUBTARGETS    = ";     // subtargets are sub-directory
        for(int target = 0; target < targets.size(); ++target)
            t << " \\\n\t\t" << targets.at(target)->target;
        t << Qt::endl << Qt::endl;
    }
    writeExtraVariables(t);

    QStringList targetSuffixes;
    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    if (!(flags & SubTargetSkipDefaultTargets)) {
        targetSuffixes << "make_first" << "all" << "clean" << "distclean"
                       << QString((flags & SubTargetInstalls) ? "install_subtargets" : "install")
                       << QString((flags & SubTargetInstalls) ? "uninstall_subtargets" : "uninstall");
    }

    struct SequentialInstallData
    {
        QString targetPrefix;
        QString commands;
        QTextStream commandsStream;
        SequentialInstallData() : commandsStream(&commands) {}
    };
    std::unique_ptr<SequentialInstallData> sequentialInstallData;
    bool dont_recurse = project->isActiveConfig("dont_recurse");

    // generate target rules
    for(int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

        //qmake it
        QString out;
        QString in;
        if(!subtarget->profile.isEmpty()) {
            out = subtarget->makefile;
            in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
            if(out.startsWith(in_directory))
                out = out.mid(in_directory.size());
            out = escapeFilePath(out);
            t << subtarget->target << "-qmake_all: ";
            if (flags & SubTargetOrdered) {
                if (target)
                    t << targets.at(target - 1)->target << "-qmake_all";
            } else {
                if (!subtarget->depends.isEmpty())
                    t << valGlue(subtarget->depends, QString(), "-qmake_all ", "-qmake_all");
            }
            t << " FORCE\n\t";
            if(!in_directory.isEmpty()) {
                t << mkdir_p_asstring(out_directory)
                  << out_directory_cdin;
            }
            t << "$(QMAKE) -o " << out << ' ' << in << buildArgs(false);
            if (!dont_recurse)
                writeSubMakeCall(t, out_directory_cdin, makefilein + " qmake_all");
            else
                t << Qt::endl;
        }

        { //actually compile
            t << subtarget->target << ":";
            auto extraDeps = extraSubTargetDependencies();
            if (!extraDeps.isEmpty())
                t << " " << valList(extraDeps);
            if(!subtarget->depends.isEmpty())
                t << " " << valList(subtarget->depends);
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein);
        }

        for(int suffix = 0; suffix < targetSuffixes.size(); ++suffix) {
            QString s = targetSuffixes.at(suffix);
            if(s == "install_subtargets")
                s = "install";
            else if(s == "uninstall_subtargets")
                s = "uninstall";
            else if(s == "make_first")
                s = QString();

            if (project->isActiveConfig("build_all") && s == "install") {
                if (!sequentialInstallData)
                    sequentialInstallData.reset(new SequentialInstallData);
                sequentialInstallData->targetPrefix += subtarget->target + '-';
                writeSubTargetCall(sequentialInstallData->commandsStream, in_directory, in,
                                   out_directory, out, out_directory_cdin,
                                   makefilein + " " + s);
                chopEndLines(&sequentialInstallData->commands);
            }

            if(flags & SubTargetOrdered) {
                t << subtarget->target << "-" << targetSuffixes.at(suffix) << "-ordered:";
                if(target)
                    t << " " << targets.at(target-1)->target << "-" << targetSuffixes.at(suffix) << "-ordered ";
                t << " FORCE";
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + s);
            }
            t << subtarget->target << "-" << targetSuffixes.at(suffix) << ":";
            if(!subtarget->depends.isEmpty())
                t << " " << valGlue(subtarget->depends, QString(), "-" + targetSuffixes.at(suffix) + " ",
                                    "-"+targetSuffixes.at(suffix));
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein + " " + s);
        }
    }
    t << Qt::endl;

    if (sequentialInstallData) {
        t << sequentialInstallData->targetPrefix << "install: FORCE"
          << sequentialInstallData->commands << Qt::endl << Qt::endl;
    }

    if (!(flags & SubTargetSkipDefaultTargets)) {
        writeMakeQmake(t, true);

        t << "qmake_all:";
        if(!targets.isEmpty()) {
            for(QList<SubTarget*>::Iterator it = targets.begin(); it != targets.end(); ++it) {
                if(!(*it)->profile.isEmpty())
                    t << " " << (*it)->target << "-qmake_all";
            }
        }
        t << " FORCE\n\n";
    }

    for(int s = 0; s < targetSuffixes.size(); ++s) {
        QString suffix = targetSuffixes.at(s);
        if(!(flags & SubTargetInstalls) && suffix.endsWith("install"))
            continue;

        t << suffix << ":";
        for(int target = 0; target < targets.size(); ++target) {
            SubTarget *subTarget = targets.at(target);
            const ProStringList &config = project->values(ProKey(subTarget->name + ".CONFIG"));
            if (suffix == "make_first"
                && config.indexOf("no_default_target") != -1) {
                continue;
            }
            if((suffix == "install_subtargets" || suffix == "uninstall_subtargets")
                && config.indexOf("no_default_install") != -1) {
                continue;
            }
            QString targetRule = subTarget->target + "-" + suffix;
            if(flags & SubTargetOrdered)
                targetRule += "-ordered";
            t << " " << targetRule;
        }
        if(suffix == "all" || suffix == "make_first")
            t << ' ' << depVar("ALL_DEPS");
        if(suffix == "clean")
            t << ' ' << depVar("CLEAN_DEPS");
        else if (suffix == "distclean")
            t << ' ' << depVar("DISTCLEAN_DEPS");
        t << " FORCE\n";
        if(suffix == "clean") {
            t << fixFileVarGlue("QMAKE_CLEAN", "\t-$(DEL_FILE) ", "\n\t-$(DEL_FILE) ", "\n");
        } else if(suffix == "distclean") {
            QString ofile = fileFixify(Option::output.fileName());
            if(!ofile.isEmpty())
                t << "\t-$(DEL_FILE) " << escapeFilePath(ofile) << Qt::endl;
            t << fixFileVarGlue("QMAKE_DISTCLEAN", "\t-$(DEL_FILE) ", " ", "\n");
        }
    }

    // user defined targets
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator qut_it = qut.begin(); qut_it != qut.end(); ++qut_it) {
        const ProStringList &config = project->values(ProKey(*qut_it + ".CONFIG"));
        QString targ = var(ProKey(*qut_it + ".target")),
                 cmd = var(ProKey(*qut_it + ".commands")), deps;
        if(targ.isEmpty())
            targ = (*qut_it).toQString();
        t << Qt::endl;

        const ProStringList &deplist = project->values(ProKey(*qut_it + ".depends"));
        for (ProStringList::ConstIterator dep_it = deplist.begin(); dep_it != deplist.end(); ++dep_it) {
            QString dep = var(ProKey(*dep_it + ".target"));
            if(dep.isEmpty())
                dep = (*dep_it).toQString();
            deps += ' ' + escapeDependencyPath(Option::fixPathToTargetOS(dep, false));
        }
        if (config.indexOf("recursive") != -1) {
            QSet<QString> recurse;
            const ProKey rkey(*qut_it + ".recurse");
            if (project->isSet(rkey)) {
                const QStringList values = project->values(rkey).toQStringList();
                recurse = QSet<QString>(values.begin(), values.end());
            } else {
                for(int target = 0; target < targets.size(); ++target)
                    recurse.insert(targets.at(target)->name);
            }
            for(int target = 0; target < targets.size(); ++target) {
                SubTarget *subtarget = targets.at(target);
                QString in_directory = subtarget->in_directory;
                if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
                    in_directory += Option::dir_sep;
                QString out_directory = subtarget->out_directory;
                if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
                    out_directory += Option::dir_sep;
                if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
                    out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

                if(!recurse.contains(subtarget->name))
                    continue;

                QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                                     : "\n\tcd " + escapeFilePath(out_directory) + " && ";
                QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

                QString out;
                QString in;
                if (!subtarget->profile.isEmpty()) {
                    out = subtarget->makefile;
                    in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
                    if (out.startsWith(in_directory))
                        out = out.mid(in_directory.size());
                    out = escapeFilePath(out);
                }

                //write the rule/depends
                if(flags & SubTargetOrdered) {
                    const QString dep = subtarget->target + "-" + (*qut_it) + "_ordered";
                    t << dep << ":";
                    if(target)
                        t << " " << targets.at(target-1)->target << "-" << (*qut_it) << "_ordered ";
                    deps += " " + dep;
                } else {
                    const QString dep = subtarget->target + "-" + (*qut_it);
                    t << dep << ":";
                    if(!subtarget->depends.isEmpty())
                        t << " " << valGlue(subtarget->depends, QString(), "-" + (*qut_it) + " ", "-" + (*qut_it));
                    deps += " " + dep;
                }

                QString sub_targ = targ;
                const ProKey rtkey(*qut_it + ".recurse_target");
                if (project->isSet(rtkey))
                    sub_targ = project->first(rtkey).toQString();

                //write the commands
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + sub_targ);
            }
        }
        if (config.indexOf("phony") != -1)
            deps += " FORCE";
        t << escapeDependencyPath(Option::fixPathToTargetOS(targ, false)) << ":" << deps << "\n";
        if(!cmd.isEmpty())
            t << "\t" << cmd << Qt::endl;
    }

    if(flags & SubTargetInstalls) {
        project->values("INSTALLDEPS")   += "install_subtargets";
        project->values("UNINSTALLDEPS") += "uninstall_subtargets";
        writeInstalls(t, true);
    }
    t << "FORCE:\n\n";
    suppressBuiltinRules(t);
}